

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondRvol.cpp
# Opt level: O2

void __thiscall OpenMD::HBondRvol::process(HBondRvol *this)

{
  SelectionManager *this_00;
  SelectionManager *this_01;
  int *piVar1;
  pointer pdVar2;
  int iVar3;
  int iVar4;
  Molecule *this_02;
  Molecule *pMVar5;
  ulong uVar6;
  Atom *pAVar7;
  pointer ppAVar8;
  pointer ppHVar9;
  HBondDonor *pHVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  int jj;
  int ii;
  Vector3d mPos;
  Vector3d DH;
  Vector3d dPos;
  Vector3d hPos;
  Vector3d aPos;
  Vector3d DA;
  DumpReader reader;
  int local_1368;
  int local_1364;
  SelectionSet local_1360;
  ulong local_1348;
  SelectionManager *local_1340;
  SelectionEvaluator *local_1338;
  SelectionEvaluator *local_1330;
  SelectionEvaluator *local_1328;
  pointer local_1320;
  Vector<double,_3U> local_1318;
  Vector<double,_3U> local_1300;
  Vector<double,_3U> local_12e8;
  Vector<double,_3U> local_12d0;
  Vector<double,_3U> local_12b8;
  Vector<double,_3U> local_12a0;
  DumpReader local_1288;
  
  Vector<double,_3U>::Vector(&local_1300);
  Vector<double,_3U>::Vector(&local_12d0);
  Vector<double,_3U>::Vector(&local_12e8);
  Vector<double,_3U>::Vector(&local_1318);
  Vector<double,_3U>::Vector(&local_12b8);
  DumpReader::DumpReader
            (&local_1288,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  iVar3 = DumpReader::getNFrames(&local_1288);
  this->frameCounter_ = 0;
  local_1328 = &this->evaluator1_;
  this_00 = &this->seleMan1_;
  local_1330 = &this->evaluator2_;
  this_01 = &this->seleMan2_;
  local_1338 = &this->evaluator3_;
  local_1340 = &this->seleMan3_;
  uVar6 = 0;
  while( true ) {
    if (iVar3 <= (int)uVar6) break;
    local_1348 = uVar6;
    DumpReader::readFrame(&local_1288,(int)uVar6);
    this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    if ((this->evaluator1_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_1360,local_1328);
      SelectionManager::setSelectionSet(this_00,&local_1360);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_1360.bitsets_);
    }
    if ((this->evaluator2_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_1360,local_1330);
      SelectionManager::setSelectionSet(this_01,&local_1360);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_1360.bitsets_);
    }
    if ((this->evaluator3_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_1360,local_1338);
      SelectionManager::setSelectionSet(local_1340,&local_1360);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_1360.bitsets_);
    }
    this_02 = SelectionManager::beginSelectedMolecule(this_00,&local_1364);
    while (this_02 != (Molecule *)0x0) {
      Molecule::getCom((Vector3d *)&local_1360,this_02);
      pMVar5 = SelectionManager::beginSelectedMolecule(this_01,&local_1368);
      while (pMVar5 != (Molecule *)0x0) {
        ppHVar9 = (this_02->hBondDonors_).
                  super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (ppHVar9 !=
            (this_02->hBondDonors_).
            super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001400be;
        pHVar10 = (HBondDonor *)0x0;
        while (pHVar10 != (HBondDonor *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_12a0,&pHVar10->donorAtom->super_StuntDouble);
          Vector<double,_3U>::operator=(&local_1300,&local_12a0);
          StuntDouble::getPos((Vector3d *)&local_12a0,&pHVar10->donatedHydrogen->super_StuntDouble);
          Vector<double,_3U>::operator=(&local_12e8,&local_12a0);
          operator-(&local_12a0,&local_12e8,&local_1300);
          Vector3<double>::operator=((Vector3<double> *)&local_1318,&local_12a0);
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1318);
          dVar11 = Vector<double,_3U>::length(&local_1318);
          ppAVar8 = (pMVar5->hBondAcceptors_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (ppAVar8 !=
              (pMVar5->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) goto LAB_00140099;
          pAVar7 = (Atom *)0x0;
          while (pAVar7 != (Atom *)0x0) {
            StuntDouble::getPos((Vector3d *)&local_12a0,&pAVar7->super_StuntDouble);
            Vector<double,_3U>::operator=(&local_12d0,&local_12a0);
            operator-(&local_12a0,&local_12d0,&local_1300);
            Vector3<double>::operator=((Vector3<double> *)&local_12b8,&local_12a0);
            Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_12b8);
            dVar12 = Vector<double,_3U>::length(&local_12b8);
            if (dVar12 < this->rCut_) {
              dVar13 = dot<double,3u>(&local_1318,&local_12b8);
              dVar12 = acos(dVar13 / (dVar12 * dVar11));
              if ((dVar12 * 180.0) / 3.141592653589793 < this->thetaCut_) {
                dVar12 = Vector<double,_3U>::length(&local_12e8);
                iVar4 = (int)(dVar12 / this->deltaR_);
                pdVar2 = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start;
                pdVar2[iVar4] = pdVar2[iVar4] + 1.0;
                piVar1 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + iVar4;
                *piVar1 = *piVar1 + 1;
              }
            }
            ppAVar8 = ppAVar8 + 1;
            pAVar7 = (Atom *)0x0;
            if (ppAVar8 !=
                (pMVar5->hBondAcceptors_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
LAB_00140099:
              pAVar7 = *ppAVar8;
            }
          }
          ppHVar9 = ppHVar9 + 1;
          pHVar10 = (HBondDonor *)0x0;
          if (ppHVar9 !=
              (this_02->hBondDonors_).
              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001400be:
            pHVar10 = *ppHVar9;
          }
        }
        ppAVar8 = (this_02->hBondAcceptors_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (ppAVar8 ==
            (this_02->hBondAcceptors_).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pAVar7 = (Atom *)0x0;
        }
        else {
          pAVar7 = *ppAVar8;
        }
        while (pAVar7 != (Atom *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_12a0,&pAVar7->super_StuntDouble);
          Vector<double,_3U>::operator=(&local_12d0,&local_12a0);
          ppHVar9 = (pMVar5->hBondDonors_).
                    super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_1320 = ppAVar8;
          if (ppHVar9 !=
              (pMVar5->hBondDonors_).
              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001402a8;
          pHVar10 = (HBondDonor *)0x0;
          while (pHVar10 != (HBondDonor *)0x0) {
            StuntDouble::getPos((Vector3d *)&local_12a0,&pHVar10->donorAtom->super_StuntDouble);
            Vector<double,_3U>::operator=(&local_1300,&local_12a0);
            operator-(&local_12a0,&local_12d0,&local_1300);
            Vector3<double>::operator=((Vector3<double> *)&local_12b8,&local_12a0);
            Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_12b8);
            dVar11 = Vector<double,_3U>::length(&local_12b8);
            if (dVar11 < this->rCut_) {
              StuntDouble::getPos((Vector3d *)&local_12a0,
                                  &pHVar10->donatedHydrogen->super_StuntDouble);
              Vector<double,_3U>::operator=(&local_12e8,&local_12a0);
              operator-(&local_12a0,&local_12e8,&local_1300);
              Vector3<double>::operator=((Vector3<double> *)&local_1318,&local_12a0);
              Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1318);
              dVar12 = Vector<double,_3U>::length(&local_1318);
              dVar13 = dot<double,3u>(&local_1318,&local_12b8);
              dVar11 = acos(dVar13 / (dVar11 * dVar12));
              if ((dVar11 * 180.0) / 3.141592653589793 < this->thetaCut_) {
                dVar11 = Vector<double,_3U>::length(&local_12e8);
                iVar4 = (int)(dVar11 / this->deltaR_);
                pdVar2 = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start;
                pdVar2[iVar4] = pdVar2[iVar4] + 1.0;
                piVar1 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + iVar4;
                *piVar1 = *piVar1 + 1;
              }
            }
            ppHVar9 = ppHVar9 + 1;
            pHVar10 = (HBondDonor *)0x0;
            if (ppHVar9 !=
                (pMVar5->hBondDonors_).
                super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001402a8:
              pHVar10 = *ppHVar9;
            }
          }
          ppAVar8 = local_1320 + 1;
          pAVar7 = (Atom *)0x0;
          if (ppAVar8 !=
              (this_02->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pAVar7 = *ppAVar8;
          }
        }
        pMVar5 = SelectionManager::nextSelectedMolecule(this_01,&local_1368);
      }
      this_02 = SelectionManager::nextSelectedMolecule(this_00,&local_1364);
    }
    writeDensityR(this);
    uVar6 = (ulong)(uint)((int)local_1348 + (this->super_StaticAnalyser).step_);
  }
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void HBondRvol::process() {
    Molecule* mol1;
    Molecule* mol2;
    Molecule* mol3;
    Molecule::HBondDonor* hbd1;
    Molecule::HBondDonor* hbd2;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    std::vector<Molecule::HBondDonor*>::iterator hbdj;
    std::vector<Atom*>::iterator hbai;
    std::vector<Atom*>::iterator hbaj;

    RealType r;

    Atom* hba1;
    Atom* hba2;
    Vector3d dPos;
    Vector3d aPos;
    Vector3d hPos;
    Vector3d DH;
    Vector3d DA;
    RealType DAdist, DHdist, theta, ctheta;
    int ii, jj;
    int nHB, nA, nD;

    DumpReader reader(info_, dumpFilename_);
    int nFrames   = reader.getNFrames();
    frameCounter_ = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
      }

      if (evaluator3_.isDynamic()) {
        seleMan3_.setSelectionSet(evaluator3_.evaluate());
      }

      for (mol1 = seleMan1_.beginSelectedMolecule(ii); mol1 != NULL;
           mol1 = seleMan1_.nextSelectedMolecule(ii)) {
        // We're collecting statistics on the molecules in selection 1:
        nHB           = 0;
        nA            = 0;
        nD            = 0;
        Vector3d mPos = mol1->getCom();

        for (mol2 = seleMan2_.beginSelectedMolecule(jj); mol2 != NULL;
             mol2 = seleMan2_.nextSelectedMolecule(jj)) {
          // loop over the possible donors in molecule 1:
          for (hbd1 = mol1->beginHBondDonor(hbdi); hbd1 != NULL;
               hbd1 = mol1->nextHBondDonor(hbdi)) {
            dPos = hbd1->donorAtom->getPos();
            hPos = hbd1->donatedHydrogen->getPos();
            DH   = hPos - dPos;
            currentSnapshot_->wrapVector(DH);
            DHdist = DH.length();

            // loop over the possible acceptors in molecule 2:
            for (hba2 = mol2->beginHBondAcceptor(hbaj); hba2 != NULL;
                 hba2 = mol2->nextHBondAcceptor(hbaj)) {
              aPos = hba2->getPos();
              DA   = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < rCut_) {
                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;

                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_) {
                  // molecule 1 is a Hbond donor:
                  nHB++;
                  nD++;
                  r         = hPos.length();
                  int binNo = int(r / deltaR_);
                  sliceQ_[binNo] += 1;
                  sliceCount_[binNo] += 1;
                }
              }
            }
          }

          // now loop over the possible acceptors in molecule 1:
          for (hba1 = mol1->beginHBondAcceptor(hbai); hba1 != NULL;
               hba1 = mol1->nextHBondAcceptor(hbai)) {
            aPos = hba1->getPos();

            // loop over the possible donors in molecule 2:
            for (hbd2 = mol2->beginHBondDonor(hbdj); hbd2 != NULL;
                 hbd2 = mol2->nextHBondDonor(hbdj)) {
              dPos = hbd2->donorAtom->getPos();

              DA = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < rCut_) {
                hPos = hbd2->donatedHydrogen->getPos();
                DH   = hPos - dPos;
                currentSnapshot_->wrapVector(DH);
                DHdist = DH.length();
                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;
                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_) {
                  // molecule 1 is a Hbond acceptor:
                  nHB++;
                  nA++;
                  r         = hPos.length();
                  int binNo = int(r / deltaR_);
                  sliceQ_[binNo] += 1;
                  sliceCount_[binNo] += 1;
                }
              }
            }
          }
        }
      }
      writeDensityR();
    }
  }